

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t FSE_buildDTable(FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog)

{
  U32 tableMask;
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  U16 UVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  size_t sStack_240;
  U16 symbolNext [256];
  
  bVar1 = (byte)tableLog;
  uVar9 = 1 << (bVar1 & 0x1f);
  if (maxSymbolValue < 0x100) {
    if (tableLog < 0xd) {
      uVar3 = 1;
      uVar10 = (ulong)(uVar9 - 1);
      for (uVar6 = 0; maxSymbolValue + 1 != uVar6; uVar6 = uVar6 + 1) {
        UVar7 = normalizedCounter[uVar6];
        if ((short)UVar7 == -1) {
          *(char *)((long)dt + uVar10 * 4 + 6) = (char)uVar6;
          UVar7 = 1;
          uVar10 = (ulong)((uint)uVar10 - 1);
        }
        else if ((int)((uint)(0x8000 << (bVar1 & 0x1f)) >> 0x10) <= (int)(short)UVar7) {
          uVar3 = 0;
        }
        symbolNext[uVar6] = UVar7;
      }
      *(short *)dt = (short)tableLog;
      *(undefined2 *)((long)dt + 2) = uVar3;
      uVar4 = 0;
      for (uVar6 = 0; uVar6 != maxSymbolValue + 1; uVar6 = uVar6 + 1) {
        uVar8 = normalizedCounter[uVar6];
        uVar5 = 0;
        if ((short)uVar8 < 1) {
          uVar8 = 0;
        }
        for (; uVar5 != uVar8; uVar5 = uVar5 + 1) {
          *(char *)((long)dt + (ulong)uVar4 * 4 + 6) = (char)uVar6;
          do {
            uVar4 = uVar4 + (uVar9 >> 1) + (uVar9 >> 3) + 3 & uVar9 - 1;
          } while ((uint)uVar10 < uVar4);
        }
      }
      if (uVar4 == 0) {
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          bVar2 = *(byte *)((long)dt + uVar10 * 4 + 6);
          uVar8 = symbolNext[bVar2];
          symbolNext[bVar2] = uVar8 + 1;
          uVar4 = BIT_highbit32((uint)uVar8);
          bVar2 = bVar1 - (char)uVar4;
          *(byte *)((long)dt + uVar10 * 4 + 7) = bVar2;
          *(ushort *)(dt + uVar10 + 1) = (uVar8 << (bVar2 & 0x1f)) - (short)uVar9;
        }
        sStack_240 = 0;
      }
      else {
        sStack_240 = 0xffffffffffffffff;
      }
    }
    else {
      sStack_240 = 0xffffffffffffffd4;
    }
  }
  else {
    sStack_240 = 0xffffffffffffffd2;
  }
  return sStack_240;
}

Assistant:

size_t FSE_buildDTable(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16 symbolNext[FSE_MAX_SYMBOL_VALUE+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}